

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

char * ImParseFormatFindStart(char *fmt)

{
  char cVar1;
  
  for (; (cVar1 = *fmt, cVar1 != '\0' && ((cVar1 != '%' || (fmt[1] == '%'))));
      fmt = fmt + (ulong)(cVar1 == '%') + 1) {
  }
  return fmt;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}